

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall DecPOMDPDiscrete::CreateNewRewardModel(DecPOMDPDiscrete *this)

{
  RewardModelMappingSparse *this_00;
  size_t sVar1;
  size_t sVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  if ((this->_m_initialized == true) && (this->_m_p_rModel != (RewardModel *)0x0)) {
    (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
      _vptr_QTableInterface[3])();
  }
  if ((this->super_MultiAgentDecisionProcessDiscrete)._m_sparse == true) {
    this_00 = (RewardModelMappingSparse *)operator_new(200);
    sVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    sVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x70))(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"s",&local_61);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ja",&local_62);
    RewardModelMappingSparse::RewardModelMappingSparse(this_00,sVar1,sVar2,&local_40,&local_60);
  }
  else {
    this_00 = (RewardModelMappingSparse *)operator_new(0x80);
    sVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    sVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x70))(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"s",&local_61);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ja",&local_62);
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,sVar1,sVar2,&local_40,&local_60);
  }
  this->_m_p_rModel = &this_00->super_RewardModel;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void DecPOMDPDiscrete::CreateNewRewardModel()
{
    if(_m_initialized)
    delete(_m_p_rModel);

    if(GetSparse())
        _m_p_rModel = new RewardModelMappingSparse( GetNrStates(), GetNrJointActions());
    else
        _m_p_rModel = new RewardModelMapping( GetNrStates(), GetNrJointActions());
}